

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

bool __thiscall
glslang::HlslParseContext::parseShaderStrings
          (HlslParseContext *this,TPpContext *ppContext,TInputScanner *input,bool versionWillBeError
          )

{
  int *piVar1;
  TInfoSink *this_00;
  bool bVar2;
  TSourceLoc *pTVar3;
  TInfoSinkBase *pTVar4;
  pointer s;
  HlslScanContext scanContext;
  HlslScanContext local_1d0;
  HlslGrammar local_180;
  
  (this->super_TParseContextBase).super_TParseVersions.currentScanner = input;
  TPpContext::setInput(ppContext,input,versionWillBeError);
  local_1d0._vptr_HlslScanContext = (_func_int **)&PTR__HlslScanContext_0089b6a0;
  local_1d0.parseContext = &this->super_TParseContextBase;
  local_1d0.ppContext = ppContext;
  HlslGrammar::HlslGrammar(&local_180,&local_1d0,this);
  bVar2 = HlslGrammar::parse(&local_180);
  if (bVar2) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x50])(this);
    bVar2 = (this->super_TParseContextBase).super_TParseVersions.numErrors == 0;
  }
  else {
    pTVar3 = TInputScanner::getSourceLoc(input);
    this_00 = (this->super_TParseContextBase).super_TParseVersions.infoSink;
    if (pTVar3->name == (TString *)0x0) {
      s = "";
    }
    else {
      s = (pTVar3->name->_M_dataplus)._M_p;
    }
    TInfoSinkBase::append(&this_00->info,s);
    TInfoSinkBase::append(&this_00->info,"(");
    pTVar4 = TInfoSinkBase::operator<<(&this_00->info,pTVar3->line);
    TInfoSinkBase::append(pTVar4,"): error at column ");
    pTVar4 = TInfoSinkBase::operator<<(pTVar4,pTVar3->column);
    TInfoSinkBase::append(pTVar4,", HLSL parsing failed.\n");
    piVar1 = &(this->super_TParseContextBase).super_TParseVersions.numErrors;
    *piVar1 = *piVar1 + 1;
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HlslParseContext::parseShaderStrings(TPpContext& ppContext, TInputScanner& input, bool versionWillBeError)
{
    currentScanner = &input;
    ppContext.setInput(input, versionWillBeError);

    HlslScanContext scanContext(*this, ppContext);
    HlslGrammar grammar(scanContext, *this);
    if (!grammar.parse()) {
        // Print a message formated such that if you click on the message it will take you right to
        // the line through most UIs.
        const glslang::TSourceLoc& sourceLoc = input.getSourceLoc();
        infoSink.info << sourceLoc.getFilenameStr() << "(" << sourceLoc.line << "): error at column " << sourceLoc.column
                      << ", HLSL parsing failed.\n";
        ++numErrors;
        return false;
    }

    finish();

    return numErrors == 0;
}